

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock-posix.c
# Opt level: O3

PRWLock * p_rwlock_new(void)

{
  int iVar1;
  pthread_rwlock_t *__rwlock;
  
  __rwlock = (pthread_rwlock_t *)p_malloc0(0x38);
  if (__rwlock == (pthread_rwlock_t *)0x0) {
    __rwlock = (pthread_rwlock_t *)0x0;
    printf("** Error: %s **\n","PRWLock::p_rwlock_new: failed to allocate memory");
  }
  else {
    iVar1 = pthread_rwlock_init(__rwlock,(pthread_rwlockattr_t *)0x0);
    if (iVar1 != 0) {
      printf("** Error: %s **\n","PRWLock::p_rwlock_new: pthread_rwlock_init() failed");
      p_free(__rwlock);
      __rwlock = (pthread_rwlock_t *)0x0;
    }
  }
  return (PRWLock *)__rwlock;
}

Assistant:

P_LIB_API PRWLock *
p_rwlock_new (void)
{
	PRWLock *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PRWLock))) == NULL)) {
		P_ERROR ("PRWLock::p_rwlock_new: failed to allocate memory");
		return NULL;
	}

	if (P_UNLIKELY (pthread_rwlock_init (&ret->hdl, NULL) != 0)) {
		P_ERROR ("PRWLock::p_rwlock_new: pthread_rwlock_init() failed");
		p_free (ret);
		return NULL;
	}

	return ret;
}